

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PulseStyleDeclarationSyntax::PulseStyleDeclarationSyntax
          (PulseStyleDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,
          SeparatedSyntaxList<slang::syntax::NameSyntax> *inputs,Token semi)

{
  bool bVar1;
  NameSyntax *pNVar2;
  size_t in_RCX;
  SyntaxNode *in_RDX;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_RDI;
  NameSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *rhs;
  undefined1 in_stack_ffffffffffffffc0 [16];
  MemberSyntax *in_stack_ffffffffffffffd0;
  
  rhs = (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&stack0x00000008;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc0._12_4_,
             in_stack_ffffffffffffffc0._0_8_);
  in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode = in_RDX;
  in_RDI[1].super_SyntaxListBase.childCount = in_RCX;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::SeparatedSyntaxList(in_RDI,rhs);
  in_RDI[2].elements._M_ptr = (pointer)(rhs->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[2].elements._M_extent._M_extent_value =
       *(size_t *)&(rhs->super_SyntaxListBase).super_SyntaxNode;
  in_RDI[2].super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)in_RDI;
  SeparatedSyntaxList<slang::syntax::NameSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::NameSyntax> *)0x75cc39);
  SeparatedSyntaxList<slang::syntax::NameSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
                      ((self_type *)in_RDI,(iterator_base<slang::syntax::NameSyntax_*> *)rhs);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pNVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                          *)0x75cc78);
    (pNVar2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::iterator_base<slang::syntax::NameSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

PulseStyleDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, const SeparatedSyntaxList<NameSyntax>& inputs, Token semi) :
        MemberSyntax(SyntaxKind::PulseStyleDeclaration, attributes), keyword(keyword), inputs(inputs), semi(semi) {
        this->inputs.parent = this;
        for (auto child : this->inputs)
            child->parent = this;
    }